

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O0

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
* __thiscall
Liby::
BlockingQueue<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>
::pop_wait(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
           *__return_storage_ptr__,
          BlockingQueue<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>
          *this)

{
  undefined1 local_28 [8];
  unique_lock<std::mutex> lck;
  BlockingQueue<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>
  *this_local;
  
  lck._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mutex_);
  std::condition_variable::
  wait<Liby::BlockingQueue<std::tuple<std::__cxx11::string,std::__cxx11::string,Liby::EventLoop*,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>>>::pop_wait()::_lambda()_1_>
            (&this->cond_,(unique_lock<std::mutex> *)local_28,(anon_class_8_1_8991fb9c)this);
  pop_front_imp(__return_storage_ptr__,this);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

T pop_wait() {
        std::unique_lock<std::mutex> lck(mutex_);
        cond_.wait(lck, [this] { return !queue_.empty(); });
        return pop_front_imp();
    }